

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_function.cpp
# Opt level: O3

void __thiscall
duckdb::ExpressionExecutor::Execute
          (ExpressionExecutor *this,BoundFunctionExpression *expr,ExpressionState *state,
          SelectionVector *sel,idx_t count,Vector *result)

{
  DataChunk *this_00;
  _Head_base<0UL,_duckdb::ExpressionState_*,_false> state_00;
  const_reference this_01;
  type expr_00;
  reference pvVar1;
  reference result_00;
  size_type __n;
  
  this_00 = &state->intermediate_chunk;
  DataChunk::Reset(this_00);
  if (((state->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (state->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     ((expr->children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (expr->children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    __n = 0;
    do {
      this_01 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](&expr->children,__n);
      expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(this_01);
      pvVar1 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
               ::operator[](&state->child_states,__n);
      state_00._M_head_impl =
           (pvVar1->
           super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
           .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl;
      result_00 = vector<duckdb::Vector,_true>::operator[](&this_00->data,__n);
      Execute(this,expr_00,state_00._M_head_impl,sel,count,result_00);
      __n = __n + 1;
    } while (__n < (ulong)((long)(expr->children).
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(expr->children).
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  (state->intermediate_chunk).count = count;
  DataChunk::Verify(this_00);
  if ((expr->function).function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(expr->function).function._M_invoker)
              ((_Any_data *)&(expr->function).function,this_00,state,result);
    return;
  }
  ::std::__throw_bad_function_call();
}

Assistant:

void ExpressionExecutor::Execute(const BoundFunctionExpression &expr, ExpressionState *state,
                                 const SelectionVector *sel, idx_t count, Vector &result) {
	state->intermediate_chunk.Reset();
	auto &arguments = state->intermediate_chunk;
	if (!state->types.empty()) {
		for (idx_t i = 0; i < expr.children.size(); i++) {
			D_ASSERT(state->types[i] == expr.children[i]->return_type);
			Execute(*expr.children[i], state->child_states[i].get(), sel, count, arguments.data[i]);
#ifdef DEBUG
			if (expr.children[i]->return_type.id() == LogicalTypeId::VARCHAR) {
				arguments.data[i].UTFVerify(count);
			}
#endif
		}
	}
	arguments.SetCardinality(count);
	arguments.Verify();

	D_ASSERT(expr.function.function);
	// #ifdef DEBUG
	expr.function.function(arguments, *state, result);

	VerifyNullHandling(expr, arguments, result);
	D_ASSERT(result.GetType() == expr.return_type);
}